

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageContentInsert(Fts5Storage *p,sqlite3_value **apVal,i64 *piRowid)

{
  bool bVar1;
  int iVar2;
  sqlite3 *psVar3;
  int local_3c;
  sqlite3_stmt *psStack_38;
  int i;
  sqlite3_stmt *pInsert;
  Fts5Config *pFStack_28;
  int rc;
  Fts5Config *pConfig;
  i64 *piRowid_local;
  sqlite3_value **apVal_local;
  Fts5Storage *p_local;
  
  pFStack_28 = p->pConfig;
  pInsert._4_4_ = 0;
  pConfig = (Fts5Config *)piRowid;
  piRowid_local = (i64 *)apVal;
  apVal_local = (sqlite3_value **)p;
  if (pFStack_28->eContent == 0) {
    psStack_38 = (sqlite3_stmt *)0x0;
    pInsert._4_4_ = fts5StorageGetStmt(p,3,&stack0xffffffffffffffc8,(char **)0x0);
    local_3c = 1;
    while( true ) {
      bVar1 = false;
      if (pInsert._4_4_ == 0) {
        bVar1 = local_3c <= pFStack_28->nCol + 1;
      }
      if (!bVar1) break;
      pInsert._4_4_ =
           sqlite3_bind_value(psStack_38,local_3c,(sqlite3_value *)piRowid_local[local_3c]);
      local_3c = local_3c + 1;
    }
    if (pInsert._4_4_ == 0) {
      sqlite3_step(psStack_38);
      pInsert._4_4_ = sqlite3_reset(psStack_38);
    }
    psVar3 = (sqlite3 *)sqlite3_last_insert_rowid(pFStack_28->db);
    pConfig->db = psVar3;
  }
  else {
    iVar2 = sqlite3_value_type(apVal[1]);
    if (iVar2 == 1) {
      psVar3 = (sqlite3 *)sqlite3_value_int64((sqlite3_value *)piRowid_local[1]);
      pConfig->db = psVar3;
    }
    else {
      pInsert._4_4_ = fts5StorageNewRowid((Fts5Storage *)apVal_local,(i64 *)pConfig);
    }
  }
  return pInsert._4_4_;
}

Assistant:

static int sqlite3Fts5StorageContentInsert(
  Fts5Storage *p, 
  sqlite3_value **apVal, 
  i64 *piRowid
){
  Fts5Config *pConfig = p->pConfig;
  int rc = SQLITE_OK;

  /* Insert the new row into the %_content table. */
  if( pConfig->eContent!=FTS5_CONTENT_NORMAL ){
    if( sqlite3_value_type(apVal[1])==SQLITE_INTEGER ){
      *piRowid = sqlite3_value_int64(apVal[1]);
    }else{
      rc = fts5StorageNewRowid(p, piRowid);
    }
  }else{
    sqlite3_stmt *pInsert = 0;    /* Statement to write %_content table */
    int i;                        /* Counter variable */
    rc = fts5StorageGetStmt(p, FTS5_STMT_INSERT_CONTENT, &pInsert, 0);
    for(i=1; rc==SQLITE_OK && i<=pConfig->nCol+1; i++){
      rc = sqlite3_bind_value(pInsert, i, apVal[i]);
    }
    if( rc==SQLITE_OK ){
      sqlite3_step(pInsert);
      rc = sqlite3_reset(pInsert);
    }
    *piRowid = sqlite3_last_insert_rowid(pConfig->db);
  }

  return rc;
}